

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monster.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  size_t local_1b8;
  size_t size;
  void *buf;
  flatcc_builder_t builder;
  char **argv_local;
  int argc_local;
  
  builder.refmap = (flatcc_refmap_t *)argv;
  flatcc_builder_init((flatcc_builder_t *)&buf);
  iVar1 = create_monster_bottom_up((flatcc_builder_t *)&buf,0);
  if (iVar1 != 0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/samples/monster/monster.c"
                  ,0x134,"int main(int, char **)");
  }
  size = (size_t)flatcc_builder_finalize_aligned_buffer((flatcc_builder_t *)&buf,&local_1b8);
  flatcc_builder_aligned_free((void *)size);
  flatcc_builder_reset((flatcc_builder_t *)&buf);
  iVar1 = create_monster_bottom_up((flatcc_builder_t *)&buf,1);
  if (iVar1 != 0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/samples/monster/monster.c"
                  ,0x152,"int main(int, char **)");
  }
  size = (size_t)flatcc_builder_finalize_aligned_buffer((flatcc_builder_t *)&buf,&local_1b8);
  access_monster_buffer((void *)size);
  flatcc_builder_aligned_free((void *)size);
  flatcc_builder_reset((flatcc_builder_t *)&buf);
  create_monster_top_down((flatcc_builder_t *)&buf);
  size = (size_t)flatcc_builder_finalize_buffer((flatcc_builder_t *)&buf,&local_1b8);
  iVar1 = access_monster_buffer((void *)size);
  if (iVar1 != 0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/samples/monster/monster.c"
                  ,0x159,"int main(int, char **)");
  }
  flatcc_builder_free((void *)size);
  flatcc_builder_clear((flatcc_builder_t *)&buf);
  printf("The FlatBuffer was successfully created and accessed!\n");
  return 0;
}

Assistant:

int main(int argc, char *argv[])
{
    // Create a `FlatBufferBuilder`, which will be used to create our
    // monsters' FlatBuffers.
    flatcc_builder_t builder;
    void  *buf;
    size_t size;

    // Silence warnings.
    (void)argc;
    (void)argv;

    // Initialize the builder object.
    flatcc_builder_init(&builder);
    test_assert(0 == create_monster_bottom_up(&builder, 0));

    // Allocate and extract a readable buffer from internal builder heap.
    // NOTE: Finalizing the buffer does NOT change the builder, it
    // just creates a snapshot of the builder content.
    // NOTE2: finalize_buffer uses malloc while finalize_aligned_buffer
    // uses a portable aligned allocation method. Often the malloc
    // version is sufficient, but won't work for all schema on all
    // systems. If the buffer is written to disk or network, but not
    // accessed in memory, `finalize_buffer` is also sufficient.
    // The flatcc_builder version of free or aligned_free should be used
    // instead of `free` although free will often work on POSIX systems.
    // This ensures portability and prevents issues when linking to
    // allocation libraries other than malloc.
    buf = flatcc_builder_finalize_aligned_buffer(&builder, &size);
    //buf = flatcc_builder_finalize_buffer(&builder, &size);

    // We now have a FlatBuffer we can store on disk or send over a network.
    // ** file/network code goes here :) **
    // Instead, we're going to access it right away (as if we just received it).
    //access_monster_buffer(buf);

    // prior to v0.5.0, use `aligned_free`
    flatcc_builder_aligned_free(buf);
    //free(buf);
    //
    // The builder object can optionally be reused after a reset which
    // is faster than creating a new builder. Subsequent use might
    // entirely avoid temporary allocations until finalizing the buffer.
    flatcc_builder_reset(&builder);
    test_assert(0 == create_monster_bottom_up(&builder, 1));
    buf = flatcc_builder_finalize_aligned_buffer(&builder, &size);
    access_monster_buffer(buf);
    flatcc_builder_aligned_free(buf);
    flatcc_builder_reset(&builder);
    create_monster_top_down(&builder);
    buf = flatcc_builder_finalize_buffer(&builder, &size);
    test_assert(0 == access_monster_buffer(buf));
    flatcc_builder_free(buf);
    // Eventually the builder must be cleaned up:
    flatcc_builder_clear(&builder);

    printf("The FlatBuffer was successfully created and accessed!\n");

    return 0;
}